

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts3Init(sqlite3 *db)

{
  int iVar1;
  int iVar2;
  Fts3Hash *pH;
  void *pvVar3;
  void *p;
  
  iVar1 = createModule(db,"fts4aux",(sqlite3_module *)sqlite3Fts3InitAux_fts3aux_module,(void *)0x0,
                       (_func_void_void_ptr *)0x0);
  if (iVar1 == 0) {
    iVar2 = sqlite3_initialize();
    iVar1 = 7;
    if ((iVar2 == 0) && (pH = (Fts3Hash *)sqlite3Malloc(0x20), pH != (Fts3Hash *)0x0)) {
      pH->keyClass = '\x01';
      pH->copyKey = '\x01';
      pH->ht = (_fts3ht *)0x0;
      *(undefined8 *)&pH->count = 0;
      *(undefined8 *)((long)&pH->first + 4) = 0;
      iVar1 = 7;
      pvVar3 = sqlite3Fts3HashInsert(pH,"simple",7,&simpleTokenizerModule);
      if (pvVar3 == (void *)0x0) {
        iVar1 = 7;
        pvVar3 = sqlite3Fts3HashInsert(pH,"porter",7,&porterTokenizerModule);
        if ((((((pvVar3 == (void *)0x0) &&
               (pvVar3 = sqlite3Fts3HashInsert(pH,"unicode61",10,sqlite3Fts3UnicodeTokenizer_module)
               , pvVar3 == (void *)0x0)) &&
              (iVar1 = createFunctionApi(db,"fts3_tokenizer",1,5,pH,fts3TokenizerFunc,
                                         (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *
                                         )0x0,(_func_void_sqlite3_context_ptr *)0x0,
                                         (_func_void_sqlite3_context_ptr *)0x0,
                                         (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *
                                         )0x0,(_func_void_void_ptr *)0x0), iVar1 == 0)) &&
             ((iVar1 = createFunctionApi(db,"fts3_tokenizer",2,5,pH,fts3TokenizerFunc,
                                         (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *
                                         )0x0,(_func_void_sqlite3_context_ptr *)0x0,
                                         (_func_void_sqlite3_context_ptr *)0x0,
                                         (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *
                                         )0x0,(_func_void_void_ptr *)0x0), iVar1 == 0 &&
              (iVar1 = sqlite3_overload_function(db,"snippet",-1), iVar1 == 0)))) &&
            ((iVar1 = sqlite3_overload_function(db,"offsets",1), iVar1 == 0 &&
             ((iVar1 = sqlite3_overload_function(db,"matchinfo",1), iVar1 == 0 &&
              (iVar1 = sqlite3_overload_function(db,"matchinfo",2), iVar1 == 0)))))) &&
           (iVar1 = sqlite3_overload_function(db,"optimize",1), iVar1 == 0)) {
          iVar1 = createModule(db,"fts3",&fts3Module,pH,hashDestroy);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = createModule(db,"fts4",&fts3Module,pH,(_func_void_void_ptr *)0x0);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar1 = createModule(db,"fts3tokenize",(sqlite3_module *)sqlite3Fts3InitTok_fts3tok_module
                               ,pH,(_func_void_void_ptr *)0x0);
          return iVar1;
        }
      }
      sqlite3Fts3HashClear(pH);
      sqlite3_free(pH);
    }
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3Init(sqlite3 *db){
  int rc = SQLITE_OK;
  Fts3Hash *pHash = 0;
  const sqlite3_tokenizer_module *pSimple = 0;
  const sqlite3_tokenizer_module *pPorter = 0;
#ifndef SQLITE_DISABLE_FTS3_UNICODE
  const sqlite3_tokenizer_module *pUnicode = 0;
#endif

#ifdef SQLITE_ENABLE_ICU
  const sqlite3_tokenizer_module *pIcu = 0;
  sqlite3Fts3IcuTokenizerModule(&pIcu);
#endif

#ifndef SQLITE_DISABLE_FTS3_UNICODE
  sqlite3Fts3UnicodeTokenizer(&pUnicode);
#endif

#ifdef SQLITE_TEST
  rc = sqlite3Fts3InitTerm(db);
  if( rc!=SQLITE_OK ) return rc;
#endif

  rc = sqlite3Fts3InitAux(db);
  if( rc!=SQLITE_OK ) return rc;

  sqlite3Fts3SimpleTokenizerModule(&pSimple);
  sqlite3Fts3PorterTokenizerModule(&pPorter);

  /* Allocate and initialize the hash-table used to store tokenizers. */
  pHash = sqlite3_malloc(sizeof(Fts3Hash));
  if( !pHash ){
    rc = SQLITE_NOMEM;
  }else{
    sqlite3Fts3HashInit(pHash, FTS3_HASH_STRING, 1);
  }

  /* Load the built-in tokenizers into the hash table */
  if( rc==SQLITE_OK ){
    if( sqlite3Fts3HashInsert(pHash, "simple", 7, (void *)pSimple)
     || sqlite3Fts3HashInsert(pHash, "porter", 7, (void *)pPorter) 

#ifndef SQLITE_DISABLE_FTS3_UNICODE
     || sqlite3Fts3HashInsert(pHash, "unicode61", 10, (void *)pUnicode) 
#endif
#ifdef SQLITE_ENABLE_ICU
     || (pIcu && sqlite3Fts3HashInsert(pHash, "icu", 4, (void *)pIcu))
#endif
    ){
      rc = SQLITE_NOMEM;
    }
  }

#ifdef SQLITE_TEST
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts3ExprInitTestInterface(db, pHash);
  }
#endif

  /* Create the virtual table wrapper around the hash-table and overload 
  ** the four scalar functions. If this is successful, register the
  ** module with sqlite.
  */
  if( SQLITE_OK==rc 
   && SQLITE_OK==(rc = sqlite3Fts3InitHashTable(db, pHash, "fts3_tokenizer"))
   && SQLITE_OK==(rc = sqlite3_overload_function(db, "snippet", -1))
   && SQLITE_OK==(rc = sqlite3_overload_function(db, "offsets", 1))
   && SQLITE_OK==(rc = sqlite3_overload_function(db, "matchinfo", 1))
   && SQLITE_OK==(rc = sqlite3_overload_function(db, "matchinfo", 2))
   && SQLITE_OK==(rc = sqlite3_overload_function(db, "optimize", 1))
  ){
    rc = sqlite3_create_module_v2(
        db, "fts3", &fts3Module, (void *)pHash, hashDestroy
    );
    if( rc==SQLITE_OK ){
      rc = sqlite3_create_module_v2(
          db, "fts4", &fts3Module, (void *)pHash, 0
      );
    }
    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3InitTok(db, (void *)pHash);
    }
    return rc;
  }


  /* An error has occurred. Delete the hash table and return the error code. */
  assert( rc!=SQLITE_OK );
  if( pHash ){
    sqlite3Fts3HashClear(pHash);
    sqlite3_free(pHash);
  }
  return rc;
}